

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O2

ze_result_t
tracing_layer::zeMemGetPitchFor2dImage
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,size_t imageWidth,
          size_t imageHeight,uint elementSizeInBytes,size_t *rowPitch)

{
  ulong uVar1;
  _func__ze_result_t__ze_context_handle_t_ptr__ze_device_handle_t_ptr_unsigned_long_unsigned_long_uint_unsigned_long_ptr
  *zeApiPtr;
  _ze_result_t _Var2;
  ze_result_t zVar3;
  char *pcVar4;
  undefined1 *puVar5;
  ulong *puVar6;
  _func_void__ze_mem_get_pitch_for2d_image_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *p_Var7;
  long lVar8;
  size_t i;
  ulong uVar9;
  uint elementSizeInBytes_local;
  size_t *rowPitch_local;
  size_t imageHeight_local;
  size_t imageWidth_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  APITracerCallbackDataImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_90;
  _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_78;
  ze_mem_get_pitch_for2d_image_params_t tracerParams;
  
  if (DAT_00189560 ==
      (_func__ze_result_t__ze_context_handle_t_ptr__ze_device_handle_t_ptr_unsigned_long_unsigned_long_uint_unsigned_long_ptr
       *)0x0) {
    zVar3 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    elementSizeInBytes_local = elementSizeInBytes;
    rowPitch_local = rowPitch;
    imageHeight_local = imageHeight;
    imageWidth_local = imageWidth;
    hDevice_local = hDevice;
    hContext_local = hContext;
    pcVar4 = (char *)tracingInProgress();
    if (*pcVar4 != '\0') {
      _Var2 = (*DAT_00189560)(hContext,hDevice,imageWidth,imageHeight,elementSizeInBytes,rowPitch);
      return _Var2;
    }
    puVar5 = (undefined1 *)tracingInProgress();
    *puVar5 = 1;
    tracerParams.phContext = &hContext_local;
    tracerParams.phDevice = &hDevice_local;
    tracerParams.pimageWidth = &imageWidth_local;
    tracerParams.pimageHeight = &imageHeight_local;
    tracerParams.pelementSizeInBytes = &elementSizeInBytes_local;
    tracerParams.prowPitch = &rowPitch_local;
    apiCallbackData.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    apiCallbackData.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    apiCallbackData.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    apiCallbackData.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    apiCallbackData.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    apiCallbackData.apiOrdinal =
         (_func_void__ze_mem_get_pitch_for2d_image_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *
         )0x0;
    apiCallbackData.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    puVar6 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
    if (puVar6 == (ulong *)0x0) {
      p_Var7 = (_func_void__ze_mem_get_pitch_for2d_image_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                *)0x0;
    }
    else {
      lVar8 = 0xcb0;
      for (uVar9 = 0; p_Var7 = apiCallbackData.apiOrdinal, uVar9 < *puVar6; uVar9 = uVar9 + 1) {
        uVar1 = puVar6[1];
        prologCallback.current_api_callback =
             *(_func_void__ze_mem_get_pitch_for2d_image_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
               **)((uVar1 - 0x748) + lVar8);
        p_Var7 = *(_func_void__ze_mem_get_pitch_for2d_image_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                   **)((uVar1 - 0xf0) + lVar8);
        prologCallback.pUserData = *(void **)(uVar1 + lVar8);
        std::
        vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ::push_back(&apiCallbackData.prologCallbacks,&prologCallback);
        epilogCallback.pUserData = *(void **)(puVar6[1] + lVar8);
        epilogCallback.current_api_callback = p_Var7;
        std::
        vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ::push_back(&apiCallbackData.epilogCallbacks,&epilogCallback);
        lVar8 = lVar8 + 0xcb8;
      }
    }
    zeApiPtr = DAT_00189560;
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              *)&local_78,&apiCallbackData.prologCallbacks);
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              *)&local_90,&apiCallbackData.epilogCallbacks);
    zVar3 = APITracerWrapperImp<_ze_result_t(*)(_ze_context_handle_t*,_ze_device_handle_t*,unsigned_long,unsigned_long,unsigned_int,unsigned_long*),_ze_mem_get_pitch_for2d_image_params_t*,void(*)(_ze_mem_get_pitch_for2d_image_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_pitch_for2d_image_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_pitch_for2d_image_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_pitch_for2d_image_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_pitch_for2d_image_params_t*,_ze_result_t,void*,void**)>>>,_ze_context_handle_t*&,_ze_device_handle_t*&,unsigned_long&,unsigned_long&,unsigned_int&,unsigned_long*&>
                      (zeApiPtr,&tracerParams,p_Var7,
                       (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        *)&local_78,
                       (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        *)&local_90,&hContext_local,&hDevice_local,&imageWidth_local,
                       &imageHeight_local,&elementSizeInBytes_local,&rowPitch_local);
    std::
    _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::~_Vector_base(&local_90);
    std::
    _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::~_Vector_base(&local_78);
    APITracerCallbackDataImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>
    ::~APITracerCallbackDataImp(&apiCallbackData);
  }
  return zVar3;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemGetPitchFor2dImage(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        size_t imageWidth,                              ///< [in] imageWidth
        size_t imageHeight,                             ///< [in] imageHeight
        unsigned int elementSizeInBytes,                ///< [in] Element size in bytes
        size_t * rowPitch                               ///< [out] rowPitch
        )
    {
        auto pfnGetPitchFor2dImage = context.zeDdiTable.Mem.pfnGetPitchFor2dImage;

        if( nullptr == pfnGetPitchFor2dImage)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.Mem.pfnGetPitchFor2dImage, hContext, hDevice, imageWidth, imageHeight, elementSizeInBytes, rowPitch);

        // capture parameters
        ze_mem_get_pitch_for2d_image_params_t tracerParams = {
            &hContext,
            &hDevice,
            &imageWidth,
            &imageHeight,
            &elementSizeInBytes,
            &rowPitch
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnMemGetPitchFor2dImageCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnMemGetPitchFor2dImageCb_t, Mem, pfnGetPitchFor2dImageCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.Mem.pfnGetPitchFor2dImage,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phContext,
                                                  *tracerParams.phDevice,
                                                  *tracerParams.pimageWidth,
                                                  *tracerParams.pimageHeight,
                                                  *tracerParams.pelementSizeInBytes,
                                                  *tracerParams.prowPitch);
    }